

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t strncat_from_utf8_libarchive2
                  (archive_string *as,void *_p,size_t len,archive_string_conv *sc)

{
  char *pcVar1;
  size_t sVar2;
  archive_string *paVar3;
  size_t sVar4;
  size_t local_88;
  wchar_t local_60;
  wchar_t wc;
  mbstate_t_conflict shift_state;
  uint32_t unicode;
  char *end;
  char *p;
  char *pcStack_38;
  wchar_t n;
  char *s;
  archive_string_conv *sc_local;
  size_t len_local;
  void *_p_local;
  archive_string *as_local;
  
  memset(&stack0xffffffffffffffa4,0,8);
  paVar3 = archive_string_ensure(as,as->length + len + 1);
  if (paVar3 == (archive_string *)0x0) {
    as_local._4_4_ = L'\xffffffff';
  }
  else {
    end = as->s + as->length;
    pcVar1 = as->s;
    sVar2 = as->buffer_length;
    sVar4 = __ctype_get_mb_cur_max();
    register0x00000000 = pcVar1 + (sVar2 - sVar4) + -1;
    pcStack_38 = (char *)_p;
    sc_local = (archive_string_conv *)len;
    while (p._4_4_ = _utf8_to_unicode((uint32_t *)&shift_state,pcStack_38,(size_t)sc_local),
          p._4_4_ != L'\0') {
      if (stack0xffffffffffffffb0 <= end) {
        as->length = (long)end - (long)as->s;
        sVar2 = as->length;
        sVar4 = __ctype_get_mb_cur_max();
        if (sVar4 < (ulong)((long)sc_local << 1)) {
          local_88 = (long)sc_local << 1;
        }
        else {
          local_88 = __ctype_get_mb_cur_max();
        }
        paVar3 = archive_string_ensure(as,sVar2 + local_88 + 1);
        if (paVar3 == (archive_string *)0x0) {
          return L'\xffffffff';
        }
        end = as->s + as->length;
        pcVar1 = as->s;
        sVar2 = as->buffer_length;
        sVar4 = __ctype_get_mb_cur_max();
        register0x00000000 = pcVar1 + (sVar2 - sVar4) + -1;
      }
      if (p._4_4_ < L'\0') {
        p._4_4_ = -p._4_4_;
        local_60 = L'?';
      }
      else {
        local_60 = shift_state.__count;
      }
      pcStack_38 = pcStack_38 + p._4_4_;
      sc_local = (archive_string_conv *)((long)sc_local - (long)p._4_4_);
      sVar4 = wcrtomb(end,local_60,(mbstate_t *)&stack0xffffffffffffffa4);
      if ((int)sVar4 == -1) {
        return L'\xffffffff';
      }
      end = end + (int)sVar4;
    }
    as->length = (long)end - (long)as->s;
    as->s[as->length] = '\0';
    as_local._4_4_ = L'\0';
  }
  return as_local._4_4_;
}

Assistant:

static int
strncat_from_utf8_libarchive2(struct archive_string *as,
    const void *_p, size_t len, struct archive_string_conv *sc)
{
	const char *s;
	int n;
	char *p;
	char *end;
	uint32_t unicode;
#if HAVE_WCRTOMB
	mbstate_t shift_state;

	memset(&shift_state, 0, sizeof(shift_state));
#else
	/* Clear the shift state before starting. */
	wctomb(NULL, L'\0');
#endif
	(void)sc; /* UNUSED */
	/*
	 * Allocate buffer for MBS.
	 * We need this allocation here since it is possible that
	 * as->s is still NULL.
	 */
	if (archive_string_ensure(as, as->length + len + 1) == NULL)
		return (-1);

	s = (const char *)_p;
	p = as->s + as->length;
	end = as->s + as->buffer_length - MB_CUR_MAX -1;
	while ((n = _utf8_to_unicode(&unicode, s, len)) != 0) {
		wchar_t wc;

		if (p >= end) {
			as->length = p - as->s;
			/* Re-allocate buffer for MBS. */
			if (archive_string_ensure(as,
			    as->length + max(len * 2,
			    (size_t)MB_CUR_MAX) + 1) == NULL)
				return (-1);
			p = as->s + as->length;
			end = as->s + as->buffer_length - MB_CUR_MAX -1;
		}

		/*
		 * As libarchive 2.x, translates the UTF-8 characters into
		 * wide-characters in the assumption that WCS is Unicode.
		 */
		if (n < 0) {
			n *= -1;
			wc = L'?';
		} else
			wc = (wchar_t)unicode;

		s += n;
		len -= n;
		/*
		 * Translates the wide-character into the current locale MBS.
		 */
#if HAVE_WCRTOMB
		n = (int)wcrtomb(p, wc, &shift_state);
#else
		n = (int)wctomb(p, wc);
#endif
		if (n == -1)
			return (-1);
		p += n;
	}
	as->length = p - as->s;
	as->s[as->length] = '\0';
	return (0);
}